

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::UpperSegments::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this)

{
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  local_60;
  char *local_48;
  char *word;
  char **__end4;
  char **__begin4;
  char *(*__range4) [3];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_18;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *words;
  anon_class_1_0_00000001 *this_local;
  
  words = (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *)this;
  this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)operator_new(0x20);
  absl::lts_20250127::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)this_00);
  __begin4 = &objectivec::(anonymous_namespace)::kUpperSegmentsList;
  word = "";
  local_18 = this_00;
  for (__end4 = &objectivec::(anonymous_namespace)::kUpperSegmentsList; __end4 != (char **)word;
      __end4 = __end4 + 1) {
    local_48 = *__end4;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::emplace<const_char_*const_&,_0>(&local_60,local_18,&local_48);
  }
  return (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)local_18;
}

Assistant:

const absl::flat_hash_set<absl::string_view>& UpperSegments() {
  static const auto* words = [] {
    auto* words = new absl::flat_hash_set<absl::string_view>();

    for (const auto word : kUpperSegmentsList) {
      words->emplace(word);
    }
    return words;
  }();
  return *words;
}